

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void cleanup_world(void)

{
  level_conflict *plVar1;
  store *psVar2;
  store *store;
  long lVar3;
  level_map_conflict *plVar4;
  long lVar5;
  
  for (plVar4 = maps; plVar4 != (level_map_conflict *)0x0; plVar4 = plVar4->next) {
    if (0 < plVar4->num_levels) {
      lVar3 = 0x40;
      lVar5 = 0;
      do {
        plVar1 = plVar4->levels;
        string_free(*(char **)((long)plVar1 + lVar3 + -0x28));
        string_free(*(char **)((long)plVar1 + lVar3 + -0x20));
        string_free(*(char **)((long)plVar1 + lVar3 + -0x18));
        string_free(*(char **)((long)plVar1 + lVar3 + -0x10));
        string_free(*(char **)((long)plVar1 + lVar3 + -8));
        string_free(*(char **)((long)&plVar1->index + lVar3));
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + 0x50;
      } while (lVar5 < plVar4->num_levels);
    }
    if (0 < plVar4->num_towns) {
      lVar3 = 0;
      do {
        store = plVar4->towns[lVar3].stores;
        while (store != (store *)0x0) {
          psVar2 = store->next;
          string_free(store->name);
          free_store(store);
          store = psVar2;
        }
        string_free(plVar4->towns[lVar3].code);
        lVar3 = lVar3 + 1;
      } while (lVar3 < plVar4->num_towns);
    }
    mem_free(plVar4->towns);
    string_free(plVar4->name);
    string_free(plVar4->help);
    mem_free(plVar4->levels);
  }
  return;
}

Assistant:

static void cleanup_world(void)
{
	int i;
	struct level_map *map = maps;
	while (map) {
		for (i = 0; i < map->num_levels; i++) {
			struct level *level = &map->levels[i];
			string_free(level->north);
			string_free(level->east);
			string_free(level->south);
			string_free(level->west);
			string_free(level->up);
			string_free(level->down);
		}
		for (i = 0; i < map->num_towns; i++) {
			struct town *town = &map->towns[i];
			struct store *store = town->stores, *next;
			while (store) {
				next = store->next;
				string_free((char *)store->name);
				free_store(store);
				store = next;
			}
			string_free(map->towns[i].code);
		}
		mem_free(map->towns);
		string_free(map->name);
		string_free(map->help);
		mem_free(map->levels);
		map = map->next;
	}
}